

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

void __thiscall
SuiteSessionTests::initiatorFixtureIncorrectNumInGroupCount_RejectedHelper::
~initiatorFixtureIncorrectNumInGroupCount_RejectedHelper
          (initiatorFixtureIncorrectNumInGroupCount_RejectedHelper *this)

{
  ~initiatorFixtureIncorrectNumInGroupCount_RejectedHelper
            ((initiatorFixtureIncorrectNumInGroupCount_RejectedHelper *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, IncorrectNumInGroupCount_Rejected)
{
  startLoggedOn();

  FIX42::NewOrderSingle newOrderSingle = createNewOrderSingle( "ISLD", "TW", 2 );
  FIX::Group group1(FIELD::NoAllocs, FIELD::AllocAccount);
  group1.setField(AllocAccount("account"));
  newOrderSingle.addGroup(group1);
  newOrderSingle.setField(NoAllocs(2));

  object->next( newOrderSingle, UtcTimeStamp() );
  CHECK_EQUAL(1, toReject);
}